

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O3

void __thiscall duckdb::Linenoise::RefreshMultiLine(Linenoise *this)

{
  pointer psVar1;
  uint uVar2;
  Linenoise *this_00;
  pointer phVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  char *buf;
  int iVar11;
  char *__end;
  int iVar12;
  searchMatch *match;
  _Alloc_hider this_01;
  int rows;
  int new_cursor_row;
  int new_cursor_x;
  AppendBuffer append_buffer;
  string highlight_buffer;
  int cols;
  char seq [64];
  vector<duckdb::highlightToken,_true> *in_stack_fffffffffffffeb8;
  int local_138;
  int local_134;
  undefined1 *local_130 [2];
  undefined1 local_120 [20];
  uint local_10c;
  undefined1 local_108 [40];
  Linenoise *local_e0;
  char *local_d8;
  int local_d0;
  int local_cc;
  vector<duckdb::highlightToken,_true> local_c8;
  string local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  int local_7c;
  char local_78 [72];
  
  if (this->render != true) {
    return;
  }
  iVar6 = GetPromptWidth(this);
  PositionToColAndRow(this,this->pos,&local_134,(int *)&local_10c,&local_138,&local_7c);
  uVar8 = this->maxrows;
  iVar11 = 1;
  if (uVar8 != 0) {
    iVar11 = (int)uVar8;
  }
  local_d0 = this->ofd;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  if (this->clear_screen == true) {
    this->old_cursor_rows = 0;
    this->clear_screen = false;
    iVar11 = 0;
  }
  this_01._M_p = this->buf;
  iVar12 = (this->ws).ws_row;
  if (local_138 <= iVar12) {
    buf = (char *)this->len;
    this->y_scroll = 0;
    sVar7 = 0;
    local_e0 = (Linenoise *)buf;
    goto LAB_0021b3d6;
  }
  sVar7 = this->y_scroll;
  if ((int)sVar7 < local_134) {
    if (iVar12 + (int)sVar7 < local_134) {
      iVar10 = local_134 - iVar12;
      goto LAB_0021b321;
    }
  }
  else {
    iVar10 = local_134 + -1;
LAB_0021b321:
    sVar7 = (size_t)iVar10;
    this->y_scroll = sVar7;
  }
  if (sVar7 == 0) {
    iVar10 = 0;
    sVar7 = 0;
  }
  else {
    sVar7 = ColAndRowToPosition(this,(int)sVar7,0);
    iVar10 = (int)this->y_scroll;
    iVar12 = (this->ws).ws_row;
  }
  if (iVar12 + iVar10 < local_138) {
    local_e0 = (Linenoise *)ColAndRowToPosition(this,iVar12 + iVar10,99999);
    iVar10 = (int)this->y_scroll;
  }
  else {
    local_e0 = (Linenoise *)this->len;
  }
  local_134 = local_134 - iVar10;
  local_108._0_8_ = (pointer)(local_108 + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_108,"truncate to rows %d - %d (render bytes %d to %d)","");
  if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_);
  }
  buf = (char *)((long)local_e0 + -sVar7);
  this_01._M_p = this_01._M_p + sVar7;
  local_138 = (this->ws).ws_row;
  uVar8 = (ulong)(uint)this->maxrows;
LAB_0021b3d6:
  if ((int)uVar8 < local_138) {
    this->maxrows = (long)local_138;
  }
  local_c8.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar5 = Highlighting::IsEnabled();
  if (bVar5) {
    psVar1 = (this->search_matches).
             super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>._M_impl.
             super__Vector_impl_data._M_start;
    match = (searchMatch *)0x0;
    if (this->search_index <
        (ulong)(((long)(this->search_matches).
                       super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 3) *
               -0x5555555555555555)) {
      match = psVar1 + this->search_index;
    }
    Highlighting::Tokenize
              ((vector<duckdb::highlightToken,_true> *)local_108,this_01._M_p,(size_t)buf,
               *this->buf == '.',match);
    phVar3 = local_c8.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_c8.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_108._0_8_;
    local_c8.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_108._8_8_;
    local_c8.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_108._16_8_;
    local_108._0_8_ = (pointer)0x0;
    local_108._8_8_ = (pointer)0x0;
    local_108._16_8_ = (pointer)0x0;
    if ((phVar3 != (pointer)0x0) &&
       (operator_delete(phVar3), (pointer)local_108._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_108._0_8_);
    }
    AddErrorHighlighting(this,sVar7,(idx_t)local_e0,&local_c8);
    bVar5 = AddCompletionMarker(this,this_01._M_p,(idx_t)buf,&local_a8,&local_c8);
    if (bVar5) {
      buf = (char *)local_a8._M_string_length;
      this_01._M_p = local_a8._M_dataplus._M_p;
    }
  }
  if (1 < local_138) {
    in_stack_fffffffffffffeb8 = &local_c8;
    AddContinuationMarkers_abi_cxx11_
              ((string *)local_108,this,this_01._M_p,(size_t)buf,iVar6,
               (local_134 + 1) - (uint)(this->y_scroll == 0),in_stack_fffffffffffffeb8);
    ::std::__cxx11::string::operator=((string *)&local_a8,(string *)local_108);
    buf = (char *)local_a8._M_string_length;
    this_01._M_p = local_a8._M_dataplus._M_p;
    if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_);
      buf = (char *)local_a8._M_string_length;
      this_01._M_p = local_a8._M_dataplus._M_p;
    }
  }
  bVar5 = Utf8Proc::IsValid(this_01._M_p,(size_t)buf);
  local_d8 = buf;
  if ((bVar5) && (bVar5 = Highlighting::IsEnabled(), bVar5)) {
    Highlighting::HighlightText_abi_cxx11_
              ((string *)local_108,(Highlighting *)this_01._M_p,buf,0,(size_t)buf,(size_t)&local_c8,
               in_stack_fffffffffffffeb8);
    ::std::__cxx11::string::operator=((string *)&local_a8,(string *)local_108);
    if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_);
    }
    local_d8 = (char *)local_a8._M_string_length;
    this_01._M_p = local_a8._M_dataplus._M_p;
  }
  local_108._0_8_ = local_108 + 0x10;
  local_108._8_8_ = (pointer)0x0;
  local_108._16_8_ = local_108._16_8_ & 0xffffffffffffff00;
  if (this->old_cursor_rows != (long)iVar11) {
    local_130[0] = local_120;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"go down %d","");
    if (local_130[0] != local_120) {
      operator_delete(local_130[0]);
    }
    snprintf(local_78,0x40,"\x1b[%dB",(ulong)(uint)(iVar11 - (int)this->old_cursor_rows));
    ::std::__cxx11::string::append(local_108);
  }
  local_e0 = this;
  local_cc = iVar6;
  local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)this_01._M_p;
  if (1 < iVar11) {
    iVar11 = iVar11 + -1;
    do {
      local_130[0] = local_120;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"clear+up","");
      if (local_130[0] != local_120) {
        operator_delete(local_130[0]);
      }
      ::std::__cxx11::string::append(local_108);
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  local_130[0] = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"clear","");
  paVar4 = local_88;
  iVar6 = local_cc;
  this_00 = local_e0;
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  ::std::__cxx11::string::append(local_108);
  if (this_00->y_scroll == 0) {
    ::std::__cxx11::string::append(local_108);
  }
  ::std::__cxx11::string::append(local_108,(ulong)paVar4);
  RefreshShowHints(this_00,(AppendBuffer *)local_108,iVar6);
  local_130[0] = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"pos > 0 %d","");
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  local_130[0] = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"pos == len %d","");
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  local_130[0] = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_130,"new_cursor_x == cols %d","");
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  if (((this_00->pos != 0) && (this_00->pos == this_00->len)) && (local_10c == (this_00->ws).ws_col)
     ) {
    local_130[0] = local_120;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"<newline>","");
    if (local_130[0] != local_120) {
      operator_delete(local_130[0]);
    }
    ::std::__cxx11::string::append(local_108);
    ::std::__cxx11::string::append(local_108);
    lVar9 = (long)local_138;
    local_134 = local_134 + 1;
    iVar6 = (int)(lVar9 + 1U);
    local_10c = 0;
    bVar5 = (int)this_00->maxrows <= local_138;
    local_138 = iVar6;
    if (bVar5) {
      this_00->maxrows = lVar9 + 1U;
    }
  }
  local_130[0] = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_130,"render %d rows (old rows %d)","");
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  local_130[0] = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"new_cursor_row %d","");
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  local_130[0] = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"new_cursor_x %d","");
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  local_130[0] = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"len %d","");
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  local_130[0] = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"old_cursor_rows %d","");
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  local_130[0] = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"pos %d","");
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  local_130[0] = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"max cols %d","");
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  if (local_134 < local_138) {
    local_130[0] = local_120;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"go-up %d","");
    if (local_130[0] != local_120) {
      operator_delete(local_130[0]);
    }
    snprintf(local_78,0x40,"\x1b[%dA",(ulong)(uint)(local_138 - local_134));
    ::std::__cxx11::string::append(local_108);
  }
  uVar2 = local_10c;
  local_130[0] = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"set col %d","");
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  if (uVar2 == 0) {
    local_78[0] = '\r';
    local_78[1] = '\0';
  }
  else {
    snprintf(local_78,0x40,"\r\x1b[%dC",(ulong)uVar2);
  }
  ::std::__cxx11::string::append(local_108);
  local_130[0] = local_120;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_130,anon_var_dwarf_63f1717 + 8,anon_var_dwarf_63f1717 + 9);
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  this_00->old_cursor_rows = (long)local_134;
  AppendBuffer::Write((AppendBuffer *)local_108,local_d0);
  if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_);
  }
  if (local_c8.super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Linenoise::RefreshMultiLine() {
	if (!render) {
		return;
	}
	char seq[64];
	int plen = GetPromptWidth();
	// utf8 in prompt, get render width
	int rows, cols;
	int new_cursor_row, new_cursor_x;
	PositionToColAndRow(pos, new_cursor_row, new_cursor_x, rows, cols);
	int col; /* column position, zero-based. */
	int old_rows = maxrows ? maxrows : 1;
	int fd = ofd;
	std::string highlight_buffer;
	auto render_buf = this->buf;
	auto render_len = this->len;
	idx_t render_start = 0;
	idx_t render_end = render_len;
	if (clear_screen) {
		old_cursor_rows = 0;
		old_rows = 0;
		clear_screen = false;
	}
	if (rows > ws.ws_row) {
		// the text does not fit in the terminal (too many rows)
		// enable scrolling mode
		// check if, given the current y_scroll, the cursor is visible
		// display range is [y_scroll, y_scroll + ws.ws_row]
		if (new_cursor_row < int(y_scroll) + 1) {
			y_scroll = new_cursor_row - 1;
		} else if (new_cursor_row > int(y_scroll) + int(ws.ws_row)) {
			y_scroll = new_cursor_row - ws.ws_row;
		}
		// display only characters up to the current scroll position
		if (y_scroll == 0) {
			render_start = 0;
		} else {
			render_start = ColAndRowToPosition(y_scroll, 0);
		}
		if (int(y_scroll) + int(ws.ws_row) >= rows) {
			render_end = len;
		} else {
			render_end = ColAndRowToPosition(y_scroll + ws.ws_row, 99999);
		}
		new_cursor_row -= y_scroll;
		render_buf += render_start;
		render_len = render_end - render_start;
		Linenoise::Log("truncate to rows %d - %d (render bytes %d to %d)", y_scroll, y_scroll + ws.ws_row, render_start,
		               render_end);
		rows = ws.ws_row;
	} else {
		y_scroll = 0;
	}

	/* Update maxrows if needed. */
	if (rows > (int)maxrows) {
		maxrows = rows;
	}

	vector<highlightToken> tokens;
	if (Highlighting::IsEnabled()) {
		bool is_dot_command = buf[0] == '.';
		auto match = search_index < search_matches.size() ? &search_matches[search_index] : nullptr;
		tokens = Highlighting::Tokenize(render_buf, render_len, is_dot_command, match);

		// add error highlighting
		AddErrorHighlighting(render_start, render_end, tokens);

		// add completion hint
		if (AddCompletionMarker(render_buf, render_len, highlight_buffer, tokens)) {
			render_buf = (char *)highlight_buffer.c_str();
			render_len = highlight_buffer.size();
		}
	}
	if (rows > 1) {
		// add continuation markers
		highlight_buffer = AddContinuationMarkers(render_buf, render_len, plen,
		                                          y_scroll > 0 ? new_cursor_row + 1 : new_cursor_row, tokens);
		render_buf = (char *)highlight_buffer.c_str();
		render_len = highlight_buffer.size();
	}
	if (duckdb::Utf8Proc::IsValid(render_buf, render_len)) {
		if (Highlighting::IsEnabled()) {
			highlight_buffer = Highlighting::HighlightText(render_buf, render_len, 0, render_len, tokens);
			render_buf = (char *)highlight_buffer.c_str();
			render_len = highlight_buffer.size();
		}
	}

	/* First step: clear all the lines used before. To do so start by
	 * going to the last row. */
	AppendBuffer append_buffer;
	if (old_rows - old_cursor_rows > 0) {
		Linenoise::Log("go down %d", old_rows - old_cursor_rows);
		snprintf(seq, 64, "\x1b[%dB", old_rows - int(old_cursor_rows));
		append_buffer.Append(seq);
	}

	/* Now for every row clear it, go up. */
	for (int j = 0; j < old_rows - 1; j++) {
		Linenoise::Log("clear+up");
		append_buffer.Append("\r\x1b[0K\x1b[1A");
	}

	/* Clean the top line. */
	Linenoise::Log("clear");
	append_buffer.Append("\r\x1b[0K");

	/* Write the prompt and the current buffer content */
	if (y_scroll == 0) {
		append_buffer.Append(prompt);
	}
	append_buffer.Append(render_buf, render_len);

	/* Show hints if any. */
	RefreshShowHints(append_buffer, plen);

	/* If we are at the very end of the screen with our prompt, we need to
	 * emit a newline and move the prompt to the first column. */
	Linenoise::Log("pos > 0 %d", pos > 0 ? 1 : 0);
	Linenoise::Log("pos == len %d", pos == len ? 1 : 0);
	Linenoise::Log("new_cursor_x == cols %d", new_cursor_x == ws.ws_col ? 1 : 0);
	if (pos > 0 && pos == len && new_cursor_x == ws.ws_col) {
		Linenoise::Log("<newline>", 0);
		append_buffer.Append("\n");
		append_buffer.Append("\r");
		rows++;
		new_cursor_row++;
		new_cursor_x = 0;
		if (rows > (int)maxrows) {
			maxrows = rows;
		}
	}
	Linenoise::Log("render %d rows (old rows %d)", rows, old_rows);

	/* Move cursor to right position. */
	Linenoise::Log("new_cursor_row %d", new_cursor_row);
	Linenoise::Log("new_cursor_x %d", new_cursor_x);
	Linenoise::Log("len %d", len);
	Linenoise::Log("old_cursor_rows %d", old_cursor_rows);
	Linenoise::Log("pos %d", pos);
	Linenoise::Log("max cols %d", ws.ws_col);

	/* Go up till we reach the expected position. */
	if (rows - new_cursor_row > 0) {
		Linenoise::Log("go-up %d", rows - new_cursor_row);
		snprintf(seq, 64, "\x1b[%dA", rows - new_cursor_row);
		append_buffer.Append(seq);
	}

	/* Set column. */
	col = new_cursor_x;
	Linenoise::Log("set col %d", 1 + col);
	if (col) {
		snprintf(seq, 64, "\r\x1b[%dC", col);
	} else {
		snprintf(seq, 64, "\r");
	}
	append_buffer.Append(seq);

	Linenoise::Log("\n");
	old_cursor_rows = new_cursor_row;
	append_buffer.Write(fd);
}